

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestDouble_Sign(void)

{
  int in_R9D;
  
  CheckEqualsHelper((char *)0xfa,0xc1c1d3,(char *)0x1,0xc1cbef,(char *)0x1,in_R9D);
  CheckEqualsHelper((char *)0xfb,0xc1c1d3,(char *)0x1,0xc1cc02,(char *)0x1,in_R9D);
  CheckEqualsHelper((char *)0xfc,0xc16068,(char *)0xffffffff,0xc1cc24,(char *)0xffffffff,in_R9D);
  CheckEqualsHelper((char *)0xfd,0xc1c1d3,(char *)0x1,0xc1cc47,(char *)0x1,in_R9D);
  CheckEqualsHelper((char *)0xfe,0xc16068,(char *)0xffffffff,0xc1cc5a,(char *)0xffffffff,in_R9D);
  CheckEqualsHelper((char *)0x100,0xc1c1d3,(char *)0x1,0xc1cc6e,(char *)0x1,in_R9D);
  return;
}

Assistant:

TEST(Double_Sign) {
  CHECK_EQ(1, Double(1.0).Sign());
  CHECK_EQ(1, Double(Double::Infinity()).Sign());
  CHECK_EQ(-1, Double(-Double::Infinity()).Sign());
  CHECK_EQ(1, Double(0.0).Sign());
  CHECK_EQ(-1, Double(-0.0).Sign());
  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  CHECK_EQ(1, Double(min_double64).Sign());
}